

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O2

void __thiscall
Memory::HeapBucketGroup<SmallAllocationBlockAttributes>::SweepFinalizableObjects
          (HeapBucketGroup<SmallAllocationBlockAttributes> *this,RecyclerSweep *recyclerSweep)

{
  SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
  ::Sweep(&(this->finalizableHeapBucket).
           super_SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
          ,recyclerSweep);
  SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
  ::Sweep(&(this->smallFinalizableWithBarrierHeapBucket).
           super_SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
          ,recyclerSweep);
  return;
}

Assistant:

void
HeapBucketGroup<TBlockAttributes>::SweepFinalizableObjects(RecyclerSweep& recyclerSweep)
{
    finalizableHeapBucket.Sweep(recyclerSweep);
#ifdef RECYCLER_VISITED_HOST
    recyclerVisitedHostHeapBucket.Sweep(recyclerSweep);
#endif
#ifdef RECYCLER_WRITE_BARRIER
    smallFinalizableWithBarrierHeapBucket.Sweep(recyclerSweep);
#endif
}